

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

optional<pbrt::SpectrumHandle> __thiscall
pbrt::PiecewiseLinearSpectrum::Read(PiecewiseLinearSpectrum *this,string *fn,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  span<const_float> v_00;
  optional<pbrt::SpectrumHandle> oVar5;
  span<const_float> l;
  string ret;
  vector<float,_std::allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> v;
  vector<float,_std::allocator<float>_> vals;
  string local_a8;
  float *local_88;
  iterator iStack_80;
  float *local_78;
  float *local_68;
  iterator iStack_60;
  float *local_58;
  vector<float,_std::allocator<float>_> local_50;
  int local_34;
  undefined8 extraout_RDX;
  
  ReadFloatFile(&local_50,fn);
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&local_a8,"%s: unable to read spectrum file.",fn);
    Warning((FileLoc *)0x0,local_a8._M_dataplus._M_p);
    uVar2 = extraout_RDX_02;
  }
  else {
    if (((int)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
         (int)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start & 4U) == 0) {
      local_88 = (float *)0x0;
      iStack_80._M_current = (float *)0x0;
      local_78 = (float *)0x0;
      local_58 = (float *)0x0;
      local_68 = (float *)0x0;
      iStack_60._M_current = (float *)0x0;
      if (4 < (ulong)((long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start)) {
        lVar4 = 4;
        uVar3 = 0;
        do {
          if ((uVar3 != 0) &&
             (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3 * 2] <= iStack_80._M_current[-1])) {
            local_34 = (int)uVar3;
            local_a8._M_string_length = 0;
            local_a8.field_2._M_local_buf[0] = '\0';
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            detail::stringPrintfRecursive<std::__cxx11::string_const&,int,float&,float&>
                      (&local_a8,
                       "%s: spectrum file invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                       ,fn,&local_34,iStack_80._M_current + -1,
                       (float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar4 + -4));
            Warning((FileLoc *)0x0,local_a8._M_dataplus._M_p);
            uVar2 = extraout_RDX_06;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
              uVar2 = extraout_RDX_07;
            }
            (this->lambdas).alloc.memoryResource = (memory_resource *)0x0;
            (this->lambdas).ptr = (float *)0x0;
            goto LAB_002855b8;
          }
          if (iStack_80._M_current == local_78) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_88,iStack_80,
                       (float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar4 + -4));
          }
          else {
            *iStack_80._M_current =
                 local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3 * 2];
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          if (iStack_60._M_current == local_58) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_68,iStack_60,
                       (float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar4));
          }
          else {
            *iStack_60._M_current =
                 *(float *)((long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start + lVar4);
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 8;
        } while (uVar3 < (ulong)((long)local_50.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_50.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2) >> 1);
      }
      iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x40,8);
      l.n = (long)iStack_80._M_current - (long)local_88 >> 2;
      v_00.n = (long)iStack_60._M_current - (long)local_68 >> 2;
      v_00.ptr = local_68;
      l.ptr = local_88;
      PiecewiseLinearSpectrum((PiecewiseLinearSpectrum *)CONCAT44(extraout_var,iVar1),l,v_00,alloc);
      *(undefined1 *)&(this->lambdas).ptr = 1;
      (this->lambdas).alloc.memoryResource =
           (memory_resource *)(CONCAT44(extraout_var,iVar1) | 0x3000000000000);
      uVar2 = extraout_RDX;
LAB_002855b8:
      if (local_68 != (float *)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
        uVar2 = extraout_RDX_00;
      }
      if (local_88 != (float *)0x0) {
        operator_delete(local_88,(long)local_78 - (long)local_88);
        uVar2 = extraout_RDX_01;
      }
      goto LAB_00285673;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&local_a8,"%s: extra value found in spectrum file.",fn);
    Warning((FileLoc *)0x0,local_a8._M_dataplus._M_p);
    uVar2 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
    uVar2 = extraout_RDX_04;
  }
  (this->lambdas).alloc.memoryResource = (memory_resource *)0x0;
  (this->lambdas).ptr = (float *)0x0;
LAB_00285673:
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar2 = extraout_RDX_05;
  }
  oVar5._8_8_ = uVar2;
  oVar5.optionalValue =
       (aligned_storage_t<sizeof(pbrt::SpectrumHandle),_alignof(pbrt::SpectrumHandle)>)this;
  return oVar5;
}

Assistant:

pstd::optional<SpectrumHandle> PiecewiseLinearSpectrum::Read(const std::string &fn,
                                                             Allocator alloc) {
    std::vector<Float> vals = ReadFloatFile(fn);
    if (vals.empty()) {
        Warning("%s: unable to read spectrum file.", fn);
        return {};
    } else {
        if (vals.size() % 2 != 0) {
            Warning("%s: extra value found in spectrum file.", fn);
            return {};
        }
        std::vector<Float> lambda, v;
        for (size_t i = 0; i < vals.size() / 2; ++i) {
            if (i > 0 && vals[2 * i] <= lambda.back()) {
                Warning("%s: spectrum file invalid: at %d'th entry, "
                        "wavelengths aren't "
                        "increasing: %f >= %f.",
                        fn, int(i), lambda.back(), vals[2 * i]);
                return {};
            }
            lambda.push_back(vals[2 * i]);
            v.push_back(vals[2 * i + 1]);
        }
        SpectrumHandle handle =
            alloc.new_object<PiecewiseLinearSpectrum>(lambda, v, alloc);
        return handle;
    }
}